

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnCallIndirectExpr
          (BinaryReaderInterp *this,Index sig_index,Index table_index)

{
  Result RVar1;
  Location LStack_108;
  Location local_e8;
  Var local_c0;
  Var local_78;
  
  local_e8.field_1.field_0.line = 0;
  local_e8.field_1._4_8_ = 0;
  local_e8.filename.data_ = (char *)0x0;
  local_e8.filename.size_._0_4_ = 0;
  local_e8.filename.size_._4_4_ = 0;
  Var::Var(&local_78,sig_index,&local_e8);
  LStack_108.field_1.field_0.line = 0;
  LStack_108.field_1._4_8_ = 0;
  LStack_108.filename.data_ = (char *)0x0;
  LStack_108.filename.size_._0_4_ = 0;
  LStack_108.filename.size_._4_4_ = 0;
  Var::Var(&local_c0,table_index,&LStack_108);
  RVar1 = SharedValidator::OnCallIndirect
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     &local_78,&local_c0);
  Var::~Var(&local_c0);
  Var::~Var(&local_78);
  if (RVar1.enum_ != Error) {
    Istream::Emit(this->istream_,CallIndirect,table_index,sig_index);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnCallIndirectExpr(Index sig_index,
                                              Index table_index) {
  CHECK_RESULT(
      validator_.OnCallIndirect(loc, Var(sig_index), Var(table_index)));
  istream_.Emit(Opcode::CallIndirect, table_index, sig_index);
  return Result::Ok;
}